

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.cpp
# Opt level: O2

void __thiscall xmrig::OclThread::OclThread(OclThread *this,Value *value)

{
  vector<long,_std::allocator<long>_> *this_00;
  Ch *pCVar1;
  uint uVar2;
  uint uVar3;
  Value *pVVar4;
  long lVar5;
  long local_40;
  int local_34;
  
  this->m_datasetHost = false;
  this->m_gcnAsm = true;
  (this->m_fields).super__Base_bitset<1UL>._M_w = 1;
  (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->m_bfactor = 6;
  this->m_index = 0;
  this->m_intensity = 0;
  this->m_memChunk = 2;
  this->m_stridedIndex = 2;
  this->m_unrollFactor = 8;
  this->m_worksize = 0;
  if ((value->data_).f.flags == 3) {
    this_00 = &this->m_threads;
    uVar2 = Json::getUint(value,"index",0);
    this->m_index = uVar2;
    uVar2 = Json::getUint(value,"worksize",0);
    if (0x7f < uVar2) {
      uVar2 = 0x80;
    }
    this->m_worksize = uVar2 + (uVar2 == 0);
    uVar3 = Json::getUint(value,"unroll",this->m_unrollFactor);
    uVar2 = 0x80;
    if (uVar3 < 0x80) {
      uVar2 = uVar3;
    }
    this->m_unrollFactor = uVar2 + (uVar2 == 0);
    uVar2 = Json::getUint(value,"intensity",0);
    this->m_intensity = uVar2 - uVar2 % this->m_worksize;
    pVVar4 = Json::getArray(value,"strided_index");
    if (((pVVar4->data_).f.flags == 4) && (1 < (pVVar4->data_).s.length)) {
      uVar2 = *(uint *)((ulong)(pVVar4->data_).s.str & 0xffffffffffff);
      uVar3 = 2;
      if (uVar2 < 2) {
        uVar3 = uVar2;
      }
      this->m_stridedIndex = uVar3;
      uVar2 = *(uint *)(((ulong)(pVVar4->data_).s.str & 0xffffffffffff) + 0x10);
      uVar3 = 0x12;
      if (uVar2 < 0x12) {
        uVar3 = uVar2;
      }
      this->m_memChunk = uVar3;
    }
    else {
      this->m_memChunk = 0;
      this->m_stridedIndex = 0;
      std::bitset<2UL>::set(&this->m_fields,0,false);
    }
    pVVar4 = Json::getArray(value,"threads");
    if ((pVVar4->data_).f.flags == 4) {
      std::vector<long,_std::allocator<long>_>::reserve(this_00,(ulong)(pVVar4->data_).s.length);
      pCVar1 = (pVVar4->data_).s.str;
      uVar2 = (pVVar4->data_).s.length;
      for (lVar5 = 0; (ulong)uVar2 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
        local_40 = *(long *)(((ulong)pCVar1 & 0xffffffffffff) + lVar5);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(this_00,&local_40);
      }
    }
    if ((this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_34 = -1;
      std::vector<long,_std::allocator<long>_>::emplace_back<int>(this_00,&local_34);
    }
  }
  return;
}

Assistant:

xmrig::OclThread::OclThread(const rapidjson::Value &value)
{
    if (!value.IsObject()) {
        return;
    }

    m_index         = Json::getUint(value, kIndex);
    m_worksize      = std::max(std::min(Json::getUint(value, kWorksize), 128u), 1u);
    m_unrollFactor  = std::max(std::min(Json::getUint(value, kUnroll, m_unrollFactor), 128u), 1u);

    setIntensity(Json::getUint(value, kIntensity));

    const auto &si = Json::getArray(value, kStridedIndex);
    if (si.IsArray() && si.Size() >= 2) {
        m_stridedIndex = std::min(si[0].GetUint(), 2u);
        m_memChunk     = std::min(si[1].GetUint(), 18u);
    }
    else {
        m_stridedIndex = 0;
        m_memChunk     = 0;
        m_fields.set(STRIDED_INDEX_FIELD, false);
    }

    const auto &threads = Json::getArray(value, kThreads);
    if (threads.IsArray()) {
        m_threads.reserve(threads.Size());

        for (const auto &affinity : threads.GetArray()) {
            m_threads.emplace_back(affinity.GetInt64());
        }
    }

    if (m_threads.empty()) {
        m_threads.emplace_back(-1);
    }
}